

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block_test.cc
# Opt level: O0

void __thiscall
leveldb::FilterBlockTest_EmptyBuilder_Test::TestBody(FilterBlockTest_EmptyBuilder_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_1d0;
  AssertHelper local_1b0;
  Message local_1a8;
  Slice local_1a0;
  bool local_189;
  undefined1 local_188 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_158;
  Message local_150;
  Slice local_148;
  bool local_131;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_;
  FilterBlockReader reader;
  AssertHelper local_f0;
  Message local_e8;
  string local_e0;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar;
  Slice block;
  FilterBlockBuilder builder;
  FilterBlockTest_EmptyBuilder_Test *this_local;
  
  FilterBlockBuilder::FilterBlockBuilder
            ((FilterBlockBuilder *)&block.size_,
             &(this->super_FilterBlockTest).policy_.super_FilterPolicy);
  join_0x00000010_0x00000000_ = FilterBlockBuilder::Finish((FilterBlockBuilder *)&block.size_);
  EscapeString_abi_cxx11_(&local_e0,(leveldb *)&gtest_ar.message_,(Slice *)gtest_ar._16_8_);
  testing::internal::EqHelper::
  Compare<char[21],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_c0,"\"\\\\x00\\\\x00\\\\x00\\\\x00\\\\x0b\"","EscapeString(block)",
             (char (*) [21])"\\x00\\x00\\x00\\x00\\x0b",&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/table/filter_block_test.cc"
               ,0x2f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  if (bVar1) {
    FilterBlockReader::FilterBlockReader
              ((FilterBlockReader *)&gtest_ar_.message_,
               &(this->super_FilterBlockTest).policy_.super_FilterPolicy,(Slice *)&gtest_ar.message_
              );
    Slice::Slice(&local_148,"foo");
    local_131 = FilterBlockReader::KeyMayMatch
                          ((FilterBlockReader *)&gtest_ar_.message_,0,&local_148);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_130,&local_131,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
    if (!bVar1) {
      testing::Message::Message(&local_150);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__1.message_,(internal *)local_130,
                 (AssertionResult *)"reader.KeyMayMatch(0, \"foo\")","false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_158,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/table/filter_block_test.cc"
                 ,0x31,pcVar2);
      testing::internal::AssertHelper::operator=(&local_158,&local_150);
      testing::internal::AssertHelper::~AssertHelper(&local_158);
      std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_150);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
    if (bVar1) {
      Slice::Slice(&local_1a0,"foo");
      local_189 = FilterBlockReader::KeyMayMatch
                            ((FilterBlockReader *)&gtest_ar_.message_,100000,&local_1a0);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_188,&local_189,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
      if (!bVar1) {
        testing::Message::Message(&local_1a8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_1d0,(internal *)local_188,
                   (AssertionResult *)"reader.KeyMayMatch(100000, \"foo\")","false","true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1b0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/table/filter_block_test.cc"
                   ,0x32,pcVar2);
        testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
        testing::internal::AssertHelper::~AssertHelper(&local_1b0);
        std::__cxx11::string::~string((string *)&local_1d0);
        testing::Message::~Message(&local_1a8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
    }
  }
  FilterBlockBuilder::~FilterBlockBuilder((FilterBlockBuilder *)&block.size_);
  return;
}

Assistant:

TEST_F(FilterBlockTest, EmptyBuilder) {
  FilterBlockBuilder builder(&policy_);
  Slice block = builder.Finish();
  ASSERT_EQ("\\x00\\x00\\x00\\x00\\x0b", EscapeString(block));
  FilterBlockReader reader(&policy_, block);
  ASSERT_TRUE(reader.KeyMayMatch(0, "foo"));
  ASSERT_TRUE(reader.KeyMayMatch(100000, "foo"));
}